

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

FunctionBody * __thiscall
Js::ParseableFunctionInfo::ParseAsmJs
          (ParseableFunctionInfo *this,Parser *ps,CompileScriptException *se,
          ParseNodeProg **parseTree)

{
  undefined1 *puVar1;
  Type TVar2;
  byte bVar3;
  LocalFunctionId functionId;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  NestedArray *pNVar7;
  SourceContextInfo *pSVar8;
  Type TVar9;
  code *pcVar10;
  HRESULT HVar11;
  bool bVar12;
  int iVar13;
  HRESULT HVar14;
  undefined4 *puVar15;
  FunctionBody *functionBody;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Utf8SourceInfo *pUVar16;
  char16_t *pcVar17;
  FunctionInfo *pFVar18;
  ParseableFunctionInfo *this_00;
  Type nestedCount;
  ulong uVar19;
  Type cbLength;
  HRESULT local_60;
  Type local_5c;
  charcount_t cStack_58;
  uint nextFunctionId;
  Type local_50;
  char16_t *local_48;
  Type local_40;
  Type local_3c;
  ParseableFunctionInfo *local_38;
  
  pFVar18 = (this->super_FunctionProxy).functionInfo.ptr;
  if (pFVar18 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar15 = 1;
    bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                 ,0x53e,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar12) goto LAB_00761c5d;
    *puVar15 = 0;
    pFVar18 = (this->super_FunctionProxy).functionInfo.ptr;
  }
  if ((ParseableFunctionInfo *)(pFVar18->functionBodyImpl).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar15 = 1;
    bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                 ,0x53f,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                 "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar12) goto LAB_00761c5d;
    *puVar15 = 0;
    pFVar18 = (this->super_FunctionProxy).functionInfo.ptr;
  }
  if ((pFVar18->attributes & DeferredParse) == None) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar15 = 1;
    bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                 ,0xa36,"(IsDeferredParseFunction())","IsDeferredParseFunction()");
    if (!bVar12) goto LAB_00761c5d;
    *puVar15 = 0;
  }
  if (((this->super_FunctionProxy).field_0x46 & 2) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar15 = 1;
    bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                 ,0xa37,"(m_isAsmjsMode)","m_isAsmjsMode");
    if (!bVar12) goto LAB_00761c5d;
    *puVar15 = 0;
  }
  pNVar7 = (this->nestedArray).ptr;
  if (pNVar7 == (NestedArray *)0x0) {
    nestedCount = 0;
  }
  else {
    nestedCount = pNVar7->nestedCount;
  }
  local_50 = (this->super_FunctionProxy).m_scriptContext;
  local_48 = (this->m_displayName).ptr;
  local_40 = this->m_displayNameLength;
  local_3c = this->m_displayShortNameOffset;
  pFVar18 = (this->super_FunctionProxy).functionInfo.ptr;
  pUVar16 = (this->super_FunctionProxy).m_utf8SourceInfo.ptr;
  local_38 = (ParseableFunctionInfo *)(ulong)(this->super_FunctionProxy).m_functionNumber;
  _cStack_58 = (ulong)((((pUVar16->m_srcInfo).ptr)->sourceContextInfo).ptr)->sourceContextId;
  if (pFVar18 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar15 = 1;
    bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                 ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar12) goto LAB_00761c5d;
    *puVar15 = 0;
    pFVar18 = (this->super_FunctionProxy).functionInfo.ptr;
  }
  functionId = pFVar18->functionId;
  if ((ParseableFunctionInfo *)(pFVar18->functionBodyImpl).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar15 = 1;
    bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                 ,0x546,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                 "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar12) goto LAB_00761c5d;
    *puVar15 = 0;
    pFVar18 = (this->super_FunctionProxy).functionInfo.ptr;
  }
  functionBody = FunctionBody::NewFromRecycler
                           (local_50,local_48,local_40,local_3c,nestedCount,pUVar16,(uint)local_38,
                            (uint)_cStack_58,functionId,
                            pFVar18->attributes & ~(DeferredParse|DeferredDeserialize),
                            Flags_HasNoExplicitReturnValue);
  Copy(this,&functionBody->super_ParseableFunctionInfo);
  Utf8SourceInfo::SetFunctionBody
            ((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr,
             functionBody);
  pSVar8 = (((((this->super_FunctionProxy).m_utf8SourceInfo.ptr)->m_srcInfo).ptr)->sourceContextInfo
           ).ptr;
  TVar9 = pSVar8->dwHostSourceContext;
  TVar2 = pSVar8->isHostDynamicDocument;
  bVar12 = Phases::IsEnabled((Phases *)&DAT_015bc490,DeferParsePhase);
  if ((TVar9 == 0xffffffffffffffff) || ((TVar2 & 1U) != 0)) {
    if (bVar12) {
      uVar4 = (this->super_FunctionProxy).m_functionNumber;
      iVar13 = (*(this->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
                 _vptr_IRecyclerVisitedObject[7])(this);
      pNVar7 = (this->nestedArray).ptr;
      if (pNVar7 == (NestedArray *)0x0) {
        uVar19 = 0;
      }
      else {
        uVar19 = (ulong)pNVar7->nestedCount;
      }
      pUVar16 = (this->super_FunctionProxy).m_utf8SourceInfo.ptr;
      pcVar17 = L"LdTrue";
      if (((this->super_FunctionProxy).field_0x44 & 2) == 0) {
        pcVar17 = L"LdFalse";
      }
      Output::Print(L"TestTrace: Deferred function parsed - ID: %d; Display Name: %s; Length: %d; Nested Function Count: %d; Utf8SourceInfo: %d; Source Length: %d\n; Is Top Level: %s;"
                    ,(ulong)uVar4,CONCAT44(extraout_var_00,iVar13),(ulong)this->m_cchLength,uVar19,
                    (ulong)pUVar16->m_sourceInfoId,(ulong)pUVar16->m_cchLength,pcVar17 + 2);
      goto LAB_007618df;
    }
  }
  else if (bVar12) {
    uVar4 = (this->super_FunctionProxy).m_functionNumber;
    iVar13 = (*(this->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
               _vptr_IRecyclerVisitedObject[7])(this);
    pNVar7 = (this->nestedArray).ptr;
    if (pNVar7 == (NestedArray *)0x0) {
      uVar19 = 0;
    }
    else {
      uVar19 = (ulong)pNVar7->nestedCount;
    }
    pUVar16 = (this->super_FunctionProxy).m_utf8SourceInfo.ptr;
    pcVar17 = L"LdTrue";
    if (((this->super_FunctionProxy).field_0x44 & 2) == 0) {
      pcVar17 = L"LdFalse";
    }
    Output::Print(L"TestTrace: Deferred function parsed - ID: %d; Display Name: %s; Length: %d; Nested Function Count: %d; Utf8SourceInfo: %d; Source Length: %d; Is Top Level: %s; Source Url: %s\n"
                  ,(ulong)uVar4,CONCAT44(extraout_var,iVar13),(ulong)this->m_cchLength,uVar19,
                  (ulong)pUVar16->m_sourceInfoId,(ulong)pUVar16->m_cchLength,pcVar17 + 2,
                  (((((pUVar16->m_srcInfo).ptr)->sourceContextInfo).ptr)->field_5).field_0.url);
LAB_007618df:
    Output::Flush();
  }
  if ((functionBody->field_0x179 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar15 = 1;
    bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                 ,0xa5a,"(!funcBody->HasExecutionDynamicProfileInfo())",
                                 "!funcBody->HasExecutionDynamicProfileInfo()");
    if (!bVar12) goto LAB_00761c5d;
    *puVar15 = 0;
  }
  pUVar16 = ScriptContext::GetSource
                      ((this->super_FunctionProxy).m_scriptContext,
                       (functionBody->super_ParseableFunctionInfo).m_sourceIndex);
  bVar3 = pUVar16->field_0xa8;
  uVar4 = this->m_cbStartOffset;
  _cStack_58 = CONCAT44(nextFunctionId,this->m_cchStartOffset);
  uVar5 = this->m_cbLength;
  local_38 = this;
  pcVar17 = (char16_t *)
            Utf8SourceInfo::GetSource
                      ((this->super_FunctionProxy).m_utf8SourceInfo.ptr,
                       L"ParseableFunctionInfo::GetStartOfDocument");
  uVar6 = (functionBody->super_ParseableFunctionInfo).m_grfscr;
  pFVar18 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  cbLength = (Type)(ulong)uVar5;
  if (pFVar18 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    local_50 = (Type)(ulong)uVar5;
    local_48 = pcVar17;
    Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar15 = 1;
    bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                 ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar12) goto LAB_00761c5d;
    *puVar15 = 0;
    pFVar18 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    pcVar17 = local_48;
    cbLength = local_50;
  }
  local_5c = pFVar18->functionId;
  local_60 = Parser::ParseSourceWithOffset
                       (ps,parseTree,(LPCUTF8)pcVar17,(ulong)uVar4,(size_t)cbLength,cStack_58,
                        (bool)((bVar3 & 2) >> 1),uVar6 | 0x1800000,se,&local_5c,
                        (functionBody->super_ParseableFunctionInfo).m_lineNumber,
                        (((((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.
                            m_utf8SourceInfo.ptr)->m_srcInfo).ptr)->sourceContextInfo).ptr,
                        &functionBody->super_ParseableFunctionInfo);
  this_00 = local_38;
  if (-1 < local_60) {
    if ((functionBody->super_ParseableFunctionInfo).deferredParseNextFunctionId != local_5c) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar15 = 1;
      bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                   ,0xa71,
                                   "(((HRESULT)(hrParser)<0) || funcBody->deferredParseNextFunctionId == nextFunctionId)"
                                   ,
                                   "FAILED(hrParser) || funcBody->deferredParseNextFunctionId == nextFunctionId"
                                  );
      if (!bVar12) goto LAB_00761c5d;
      *puVar15 = 0;
    }
LAB_00761b61:
    FunctionProxy::UpdateFunctionBodyImpl(&this_00->super_FunctionProxy,functionBody);
    puVar1 = &(this_00->super_FunctionProxy).field_0x45;
    *puVar1 = *puVar1 | 2;
    bVar12 = FunctionProxy::IsFunctionBody((FunctionProxy *)functionBody);
    if (!bVar12) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar15 = 1;
      bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                   ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
      if (!bVar12) {
LAB_00761c5d:
        pcVar10 = (code *)invalidInstructionException();
        (*pcVar10)();
      }
      *puVar15 = 0;
    }
    return functionBody;
  }
  HVar14 = MapDeferredReparseError(&local_60,se);
  this_00 = local_38;
  HVar11 = local_60;
  if (-1 < HVar14 || local_60 < 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar15 = 1;
    bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                 ,0xa75,
                                 "(((HRESULT)(hrParseCodeGen)<0) && ((HRESULT)(hrParser) >= 0))",
                                 "Syntax errors should never be detected on deferred re-parse");
    if (!bVar12) goto LAB_00761c5d;
    *puVar15 = 0;
    if (HVar11 < 0) {
      Throw::InternalError();
    }
    if (-1 < HVar14) goto LAB_00761b61;
  }
  if (HVar14 != -0x7ff8fff2) {
    if (HVar14 == -0x7ff5ffe4) {
      Throw::StackOverflow((local_38->super_FunctionProxy).m_scriptContext,(PVOID)0x0);
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar15 = 1;
    bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                 ,0xa84,"(hrParseCodeGen == ((HRESULT)0x8007000EL))",
                                 "hrParseCodeGen == E_OUTOFMEMORY");
    if (!bVar12) goto LAB_00761c5d;
    *puVar15 = 0;
  }
  Throw::OutOfMemory();
}

Assistant:

FunctionBody* ParseableFunctionInfo::ParseAsmJs(Parser * ps, __out CompileScriptException * se, __out ParseNodeProg ** parseTree)
    {
        Assert(IsDeferredParseFunction());
        Assert(m_isAsmjsMode);

        FunctionBody* returnFunctionBody = nullptr;
        FunctionBody* funcBody = nullptr;

        funcBody = FunctionBody::NewFromRecycler(
            this->m_scriptContext,
            this->m_displayName,
            this->m_displayNameLength,
            this->m_displayShortNameOffset,
            this->GetNestedCount(),
            this->GetUtf8SourceInfo(),
            this->m_functionNumber,
            this->GetUtf8SourceInfo()->GetSrcInfo()->sourceContextInfo->sourceContextId,
            this->GetLocalFunctionId(),
            (FunctionInfo::Attributes)(this->GetAttributes() & ~(FunctionInfo::Attributes::DeferredDeserialize | FunctionInfo::Attributes::DeferredParse)),
            Js::FunctionBody::FunctionBodyFlags::Flags_HasNoExplicitReturnValue
#ifdef PERF_COUNTERS
            , false /* is function from deferred deserialized proxy */
#endif
            );

        this->Copy(funcBody);
        PERF_COUNTER_DEC(Code, DeferredFunction);

        if (!this->GetSourceContextInfo()->IsDynamic())
        {
            PHASE_PRINT_TESTTRACE1(Js::DeferParsePhase, _u("TestTrace: Deferred function parsed - ID: %d; Display Name: %s; Length: %d; Nested Function Count: %d; Utf8SourceInfo: %d; Source Length: %d; Is Top Level: %s; Source Url: %s\n"), m_functionNumber, this->GetDisplayName(), this->m_cchLength, this->GetNestedCount(), this->m_utf8SourceInfo->GetSourceInfoId(), this->m_utf8SourceInfo->GetCchLength(), this->GetIsTopLevel() ? _u("True") : _u("False"), this->GetSourceContextInfo()->url);
        }
        else
        {
            PHASE_PRINT_TESTTRACE1(Js::DeferParsePhase, _u("TestTrace: Deferred function parsed - ID: %d; Display Name: %s; Length: %d; Nested Function Count: %d; Utf8SourceInfo: %d; Source Length: %d\n; Is Top Level: %s;"), m_functionNumber, this->GetDisplayName(), this->m_cchLength, this->GetNestedCount(), this->m_utf8SourceInfo->GetSourceInfoId(), this->m_utf8SourceInfo->GetCchLength(), this->GetIsTopLevel() ? _u("True") : _u("False"));
        }

#if ENABLE_PROFILE_INFO
        Assert(!funcBody->HasExecutionDynamicProfileInfo());
#endif

        HRESULT hrParser = NO_ERROR;
        HRESULT hrParseCodeGen = NO_ERROR;

        bool isCesu8 = m_scriptContext->GetSource(funcBody->GetSourceIndex())->IsCesu8();

        size_t offset = this->StartOffset();
        charcount_t charOffset = this->StartInDocument();
        size_t length = this->LengthInBytes();

        LPCUTF8 pszStart = this->GetStartOfDocument();

        uint32 grfscr = funcBody->GetGrfscr() | fscrDeferredFnc | fscrDeferredFncExpression;

        uint nextFunctionId = funcBody->GetLocalFunctionId();

        // if parser throws, it will be caught by function trying to bytecode gen the asm.js module, so don't need to catch/rethrow here
        hrParser = ps->ParseSourceWithOffset(parseTree, pszStart, offset, length, charOffset, isCesu8, grfscr, se,
                    &nextFunctionId, funcBody->GetRelativeLineNumber(), funcBody->GetSourceContextInfo(),
                    funcBody);

        Assert(FAILED(hrParser) || funcBody->deferredParseNextFunctionId == nextFunctionId);
        if (FAILED(hrParser))
        {
            hrParseCodeGen = MapDeferredReparseError(hrParser, *se); // Map certain errors like OOM/SOE
            AssertMsg(FAILED(hrParseCodeGen) && SUCCEEDED(hrParser), "Syntax errors should never be detected on deferred re-parse");
        }

        if (!SUCCEEDED(hrParser))
        {
            Throw::InternalError();
        }
        else if (!SUCCEEDED(hrParseCodeGen))
        {
            if (hrParseCodeGen == VBSERR_OutOfStack)
            {
                Throw::StackOverflow(m_scriptContext, nullptr);
            }
            else
            {
                Assert(hrParseCodeGen == E_OUTOFMEMORY);
                Throw::OutOfMemory();
            }
        }

        UpdateFunctionBodyImpl(funcBody);
        m_hasBeenParsed = true;

        Assert(funcBody->GetFunctionBody() == funcBody);

        returnFunctionBody = funcBody;

        return returnFunctionBody;
    }